

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superAnd.c
# Opt level: O3

int Super2_LibCompareGates(Super2_Gate_t **ppG1,Super2_Gate_t **ppG2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (*ppG1)->uTruth;
  uVar2 = ~uVar1 & s_uMaskAll;
  if ((s_uMaskBit & uVar1) == 0) {
    uVar2 = uVar1;
  }
  uVar1 = (*ppG2)->uTruth;
  uVar3 = ~uVar1 & s_uMaskAll;
  if ((uVar1 & s_uMaskBit) == 0) {
    uVar3 = uVar1;
  }
  return -(uint)(uVar2 < uVar3) | 1;
}

Assistant:

int Super2_LibCompareGates( Super2_Gate_t ** ppG1, Super2_Gate_t ** ppG2 )
{
    Super2_Gate_t * pG1  = *ppG1;
    Super2_Gate_t * pG2  = *ppG2;
    unsigned uTruth1, uTruth2;

    uTruth1 = (pG1->uTruth & s_uMaskBit)? s_uMaskAll & ~pG1->uTruth : pG1->uTruth;
    uTruth2 = (pG2->uTruth & s_uMaskBit)? s_uMaskAll & ~pG2->uTruth : pG2->uTruth;

    if ( uTruth1 < uTruth2 )
        return -1;
    return 1;
}